

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O1

ModportPortSymbol *
slang::ast::ModportPortSymbol::fromSyntax
          (ASTContext *context,ArgumentDirection direction,ModportNamedPortSyntax *syntax)

{
  SymbolIndex SVar1;
  Compilation *this;
  SourceLocation loc;
  bitmask<slang::ast::ASTFlags> bVar2;
  bool bVar3;
  ModportPortSymbol *pMVar4;
  Symbol *pSVar5;
  Diagnostic *this_00;
  DeclaredType *target;
  Expression *expr;
  DiagCode code;
  string_view sVar6;
  SourceRange SVar7;
  LookupLocation location;
  Token name;
  ASTContext checkCtx;
  undefined1 isDottedAccess;
  ArgumentDirection local_bc;
  ASTContext *local_b8;
  Compilation *local_b0;
  Scope *local_a8;
  Scope *local_a0;
  SourceRange local_98;
  Token local_88;
  SourceLocation local_70;
  ASTContext local_68;
  
  this = ((context->scope).ptr)->compilation;
  local_88.kind = (syntax->name).kind;
  local_88._2_1_ = (syntax->name).field_0x2;
  local_88.numFlags.raw = (syntax->name).numFlags.raw;
  local_88.rawLen = (syntax->name).rawLen;
  local_88.info = (syntax->name).info;
  local_bc = direction;
  local_68._0_16_ = parsing::Token::valueText(&local_88);
  local_70 = parsing::Token::location(&local_88);
  local_b0 = this;
  pMVar4 = BumpAllocator::
           emplace<slang::ast::ModportPortSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::ArgumentDirection&>
                     (&this->super_BumpAllocator,
                      (basic_string_view<char,_std::char_traits<char>_> *)&local_68,&local_70,
                      &local_bc);
  (pMVar4->super_ValueSymbol).super_Symbol.originatingSyntax = (SyntaxNode *)syntax;
  local_a0 = (context->scope).ptr;
  sVar6 = parsing::Token::valueText(&local_88);
  local_a8 = (context->scope).ptr;
  SVar1 = context->lookupIndex;
  local_b8 = context;
  local_98 = parsing::Token::range(&local_88);
  isDottedAccess = local_98.endLoc._0_1_;
  location.index = SVar1;
  location.scope = local_a8;
  location._12_4_ = 0;
  pSVar5 = Lookup::unqualifiedAt
                     (local_a0,sVar6,location,local_98,(bitmask<slang::ast::LookupFlags>)0x40);
  pMVar4->internalSymbol = pSVar5;
  if (pSVar5 != (Symbol *)0x0) {
    code.subsystem = Declarations;
    code.code = 0x36;
    if (pSVar5->kind != Subroutine) {
      bVar3 = SemanticFacts::isAllowedInModport(pSVar5->kind);
      code.subsystem = Declarations;
      code.code = 0x8f;
      if (bVar3) goto LAB_00349f33;
    }
    SVar7 = parsing::Token::range(&local_88);
    this_00 = ASTContext::addDiag(local_b8,code,SVar7);
    sVar6 = parsing::Token::valueText(&local_88);
    Diagnostic::operator<<(this_00,sVar6);
    Diagnostic::addNote(this_00,(DiagCode)0x50001,pMVar4->internalSymbol->location);
    pMVar4->internalSymbol = (Symbol *)0x0;
  }
LAB_00349f33:
  if (pMVar4->internalSymbol == (Symbol *)0x0) {
    (pMVar4->super_ValueSymbol).declaredType.type = local_b0->errorType;
  }
  else {
    target = Symbol::getDeclaredType(pMVar4->internalSymbol);
    DeclaredType::setLink(&(pMVar4->super_ValueSymbol).declaredType,target);
    ASTContext::resetFlags(&local_68,local_b8,(bitmask<slang::ast::ASTFlags>)0x100000020);
    bVar2.m_bits = local_68.flags.m_bits;
    if (local_bc != In) {
      bVar2.m_bits = local_68.flags.m_bits | 0x100000;
      if (local_bc == InOut) {
        bVar2.m_bits = local_68.flags.m_bits | 0x4000100000;
      }
    }
    local_68.flags.m_bits = bVar2.m_bits;
    loc = (pMVar4->super_ValueSymbol).super_Symbol.location;
    SVar7.startLoc = (pMVar4->super_ValueSymbol).super_Symbol.name._M_len * 0x10000000 + (long)loc;
    SVar7.endLoc = (SourceLocation)0x0;
    expr = ValueExpressionBase::fromSymbol
                     ((ValueExpressionBase *)&local_68,(ASTContext *)pMVar4->internalSymbol,
                      (Symbol *)0x0,(HierarchicalReference *)loc,SVar7,false,(bool)isDottedAccess);
    Expression::checkConnectionDirection
              (expr,local_bc,&local_68,loc,(bitmask<slang::ast::AssignFlags>)0x0);
    pMVar4->connExpr = expr;
  }
  return pMVar4;
}

Assistant:

ModportPortSymbol& ModportPortSymbol::fromSyntax(const ASTContext& context,
                                                 ArgumentDirection direction,
                                                 const ModportNamedPortSyntax& syntax) {
    auto& comp = context.getCompilation();
    auto name = syntax.name;
    auto result = comp.emplace<ModportPortSymbol>(name.valueText(), name.location(), direction);
    result->setSyntax(syntax);
    result->internalSymbol = Lookup::unqualifiedAt(*context.scope, name.valueText(),
                                                   context.getLocation(), name.range(),
                                                   LookupFlags::NoParentScope);

    if (result->internalSymbol) {
        if (result->internalSymbol->kind == SymbolKind::Subroutine) {
            auto& diag = context.addDiag(diag::ExpectedImportExport, name.range());
            diag << name.valueText();
            diag.addNote(diag::NoteDeclarationHere, result->internalSymbol->location);
            result->internalSymbol = nullptr;
        }
        else if (!SemanticFacts::isAllowedInModport(result->internalSymbol->kind)) {
            auto& diag = context.addDiag(diag::NotAllowedInModport, name.range());
            diag << name.valueText();
            diag.addNote(diag::NoteDeclarationHere, result->internalSymbol->location);
            result->internalSymbol = nullptr;
        }
    }

    if (!result->internalSymbol) {
        result->setType(comp.getErrorType());
        return *result;
    }

    auto sourceType = result->internalSymbol->getDeclaredType();
    SLANG_ASSERT(sourceType);
    result->getDeclaredType()->setLink(*sourceType);

    // Perform checking on the connected symbol to make sure it's allowed
    // given the modport's direction.
    ASTContext checkCtx = context.resetFlags(ASTFlags::NonProcedural | ASTFlags::NotADriver);
    if (direction != ArgumentDirection::In) {
        checkCtx.flags |= ASTFlags::LValue;
        if (direction == ArgumentDirection::InOut)
            checkCtx.flags |= ASTFlags::LAndRValue;
    }

    auto loc = result->location;
    auto& expr = ValueExpressionBase::fromSymbol(checkCtx, *result->internalSymbol, nullptr,
                                                 {loc, loc + result->name.length()});

    Expression::checkConnectionDirection(expr, direction, checkCtx, loc);

    result->connExpr = &expr;
    return *result;
}